

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

String * __thiscall
kj::str<unsigned_char_const(&)[3]>(String *__return_storage_ptr__,kj *this,uchar (*params) [3])

{
  CappedArray<char,_17UL> *params_00;
  CappedArray<char,_17UL> local_30;
  
  toCharSequence<unsigned_char_const(&)[3]>(&local_30,this,params);
  _::concat<kj::CappedArray<char,17ul>>(__return_storage_ptr__,(_ *)&local_30,params_00);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}